

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_int16 *
ma_dr_mp3__full_read_and_close_s16
          (ma_dr_mp3 *pMP3,ma_dr_mp3_config *pConfig,ma_uint64 *pTotalFrameCount)

{
  ulong uVar1;
  _func_void_void_ptr_void_ptr *p_Var2;
  ulong framesToRead;
  ma_uint32 mVar3;
  ma_uint64 mVar4;
  ma_int16 *pmVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  ma_int16 temp [4096];
  ma_int16 *local_2068;
  undefined1 local_2038 [8200];
  
  local_2068 = (ma_int16 *)0x0;
  uVar8 = 0;
  uVar6 = 0;
  do {
    framesToRead = 0x1000 / (ulong)pMP3->channels;
    if ((pMP3 == (ma_dr_mp3 *)0x0) || (pMP3->onRead == (ma_dr_mp3_read_proc)0x0)) {
      mVar4 = 0;
    }
    else {
      mVar4 = ma_dr_mp3_read_pcm_frames_raw(pMP3,framesToRead,local_2038);
    }
    if (mVar4 == 0) {
      bVar10 = true;
    }
    else {
      uVar7 = uVar6 + mVar4;
      if (uVar8 < uVar7) {
        uVar1 = uVar8 * 2;
        uVar9 = uVar7;
        if (uVar7 <= uVar1 && uVar1 - uVar7 != 0) {
          uVar9 = uVar1;
        }
        pmVar5 = (ma_int16 *)
                 ma_dr_mp3__realloc_from_callbacks
                           (local_2068,uVar9 * pMP3->channels * 2,uVar1 * pMP3->channels,
                            &pMP3->allocationCallbacks);
        if (pmVar5 == (ma_int16 *)0x0) {
          bVar10 = true;
          if ((local_2068 != (ma_int16 *)0x0) &&
             (p_Var2 = (pMP3->allocationCallbacks).onFree,
             p_Var2 != (_func_void_void_ptr_void_ptr *)0x0)) {
            (*p_Var2)(local_2068,(pMP3->allocationCallbacks).pUserData);
          }
        }
        else {
          bVar10 = false;
          uVar8 = uVar9;
          local_2068 = pmVar5;
        }
        if (pmVar5 == (ma_int16 *)0x0) goto LAB_0017df0e;
      }
      bVar10 = mVar4 != framesToRead;
      memcpy(local_2068 + uVar6 * pMP3->channels,local_2038,mVar4 * pMP3->channels * 2);
      uVar6 = uVar7;
    }
LAB_0017df0e:
    if (bVar10) {
      if (pConfig != (ma_dr_mp3_config *)0x0) {
        mVar3 = pMP3->sampleRate;
        pConfig->channels = pMP3->channels;
        pConfig->sampleRate = mVar3;
      }
      ma_dr_mp3_uninit(pMP3);
      if (pTotalFrameCount != (ma_uint64 *)0x0) {
        *pTotalFrameCount = uVar6;
      }
      return local_2068;
    }
  } while( true );
}

Assistant:

static ma_int16* ma_dr_mp3__full_read_and_close_s16(ma_dr_mp3* pMP3, ma_dr_mp3_config* pConfig, ma_uint64* pTotalFrameCount)
{
    ma_uint64 totalFramesRead = 0;
    ma_uint64 framesCapacity = 0;
    ma_int16* pFrames = NULL;
    ma_int16 temp[4096];
    MA_DR_MP3_ASSERT(pMP3 != NULL);
    for (;;) {
        ma_uint64 framesToReadRightNow = MA_DR_MP3_COUNTOF(temp) / pMP3->channels;
        ma_uint64 framesJustRead = ma_dr_mp3_read_pcm_frames_s16(pMP3, framesToReadRightNow, temp);
        if (framesJustRead == 0) {
            break;
        }
        if (framesCapacity < totalFramesRead + framesJustRead) {
            ma_uint64 newFramesBufferSize;
            ma_uint64 oldFramesBufferSize;
            ma_uint64 newFramesCap;
            ma_int16* pNewFrames;
            newFramesCap = framesCapacity * 2;
            if (newFramesCap < totalFramesRead + framesJustRead) {
                newFramesCap = totalFramesRead + framesJustRead;
            }
            oldFramesBufferSize = framesCapacity * pMP3->channels * sizeof(ma_int16);
            newFramesBufferSize = newFramesCap   * pMP3->channels * sizeof(ma_int16);
            if (newFramesBufferSize > (ma_uint64)MA_SIZE_MAX) {
                break;
            }
            pNewFrames = (ma_int16*)ma_dr_mp3__realloc_from_callbacks(pFrames, (size_t)newFramesBufferSize, (size_t)oldFramesBufferSize, &pMP3->allocationCallbacks);
            if (pNewFrames == NULL) {
                ma_dr_mp3__free_from_callbacks(pFrames, &pMP3->allocationCallbacks);
                break;
            }
            pFrames = pNewFrames;
            framesCapacity = newFramesCap;
        }
        MA_DR_MP3_COPY_MEMORY(pFrames + totalFramesRead*pMP3->channels, temp, (size_t)(framesJustRead*pMP3->channels*sizeof(ma_int16)));
        totalFramesRead += framesJustRead;
        if (framesJustRead != framesToReadRightNow) {
            break;
        }
    }
    if (pConfig != NULL) {
        pConfig->channels   = pMP3->channels;
        pConfig->sampleRate = pMP3->sampleRate;
    }
    ma_dr_mp3_uninit(pMP3);
    if (pTotalFrameCount) {
        *pTotalFrameCount = totalFramesRead;
    }
    return pFrames;
}